

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void stat4Destructor(void *pOld)

{
  undefined4 local_1c;
  int i;
  Stat4Accum *p;
  void *pOld_local;
  
  for (local_1c = 0; local_1c < *(int *)((long)pOld + 8); local_1c = local_1c + 1) {
    sampleClear(*(sqlite3 **)((long)pOld + 0x70),
                (Stat4Sample *)(*(long *)((long)pOld + 0x50) + (long)local_1c * 0x30));
  }
  for (local_1c = 0; local_1c < *(int *)((long)pOld + 0x10); local_1c = local_1c + 1) {
    sampleClear(*(sqlite3 **)((long)pOld + 0x70),
                (Stat4Sample *)(*(long *)((long)pOld + 0x68) + (long)local_1c * 0x30));
  }
  sampleClear(*(sqlite3 **)((long)pOld + 0x70),(Stat4Sample *)((long)pOld + 0x18));
  sqlite3DbFree(*(sqlite3 **)((long)pOld + 0x70),pOld);
  return;
}

Assistant:

static void stat4Destructor(void *pOld){
  Stat4Accum *p = (Stat4Accum*)pOld;
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
  int i;
  for(i=0; i<p->nCol; i++) sampleClear(p->db, p->aBest+i);
  for(i=0; i<p->mxSample; i++) sampleClear(p->db, p->a+i);
  sampleClear(p->db, &p->current);
#endif
  sqlite3DbFree(p->db, p);
}